

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

string * __thiscall pegmatite::Input::iterator::filename_abi_cxx11_(iterator *this)

{
  int iVar1;
  string *this_00;
  string *local_40;
  allocator<char> local_1d [13];
  iterator *local_10;
  iterator *this_local;
  
  local_10 = this;
  if (filename[abi:cxx11]()::None_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&filename[abi:cxx11]()::None_abi_cxx11_);
    if (iVar1 != 0) {
      this_00 = (string *)operator_new(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)this_00,"<invalid input>",local_1d);
      std::allocator<char>::~allocator(local_1d);
      filename[abi:cxx11]()::None_abi_cxx11_ = this_00;
      __cxa_guard_release(&filename[abi:cxx11]()::None_abi_cxx11_);
    }
  }
  if (this->buffer == (Input *)0x0) {
    local_40 = filename[abi:cxx11]()::None_abi_cxx11_;
  }
  else {
    local_40 = name_abi_cxx11_(this->buffer);
  }
  return local_40;
}

Assistant:

const std::string& Input::iterator::filename() const
{
	static std::string& None = *new std::string("<invalid input>");
	return buffer ? buffer->name() : None;
}